

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_staj_visitor<char>::visit_typed_array
          (basic_staj_visitor<char> *this,span<const_short,_18446744073709551615UL> *data,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  ser_context *context_00;
  size_type size;
  span<const_short,_18446744073709551615UL> *in_RSI;
  long in_RDI;
  error_code *in_stack_ffffffffffffffa8;
  basic_json_visitor<char> *in_stack_ffffffffffffffc0;
  anon_union_8_10_502707a4_for_data_ in_stack_ffffffffffffffc8;
  typed_array_view *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)(in_RDI + 0x28) = 1;
  context_00 = (ser_context *)detail::span<const_short,_18446744073709551615UL>::data(in_RSI);
  size = detail::span<const_short,_18446744073709551615UL>::size(in_RSI);
  typed_array_view::typed_array_view
            ((typed_array_view *)&stack0xffffffffffffffc0,(int16_t *)context_00,size);
  typed_array_view::operator=
            (in_stack_ffffffffffffffd0,(typed_array_view *)in_stack_ffffffffffffffc8.uint8_data_);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  basic_json_visitor<char>::begin_array
            (in_stack_ffffffffffffffc0,(semantic_tag)((ulong)in_RDI >> 0x38),context_00,
             in_stack_ffffffffffffffa8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const int16_t>& data, 
        semantic_tag tag,
        const ser_context& context,
        std::error_code& ec) override
    {
        state_ = staj_cursor_state::typed_array;
        data_ = typed_array_view(data.data(), data.size());
        index_ = 0;
        this->begin_array(tag, context, ec);
        JSONCONS_VISITOR_RETURN;
    }